

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExtract.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkUpdateNetwork(Abc_ShaMan_t *p,int fAnd)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  uint uVar7;
  Abc_Obj_t *pAVar8;
  uint *__ptr;
  void *pvVar9;
  uint *__ptr_00;
  Abc_Obj_t *pAVar10;
  void *pvVar11;
  Vec_Ptr_t *pVVar12;
  Abc_Obj_t *pAVar13;
  ulong uVar14;
  Abc_Ntk_t *pAVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  long lVar20;
  long lVar21;
  
  pAVar8 = Abc_AigConst1(p->pNtk);
  uVar1 = *(uint *)(((ulong)pAVar8 & 0xfffffffffffffffe) + 0x10);
  if ((int)uVar1 < 0) {
LAB_002c4b1a:
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12e,"int Abc_Var2Lit(int, int)");
  }
  uVar7 = p->nStartCols;
  __ptr = (uint *)malloc(0x10);
  uVar16 = 8;
  if (6 < uVar7 - 1) {
    uVar16 = uVar7;
  }
  __ptr[1] = 0;
  *__ptr = uVar16;
  if (uVar16 == 0) {
    pvVar9 = (void *)0x0;
  }
  else {
    pvVar9 = malloc((long)(int)uVar16 * 8);
  }
  *(void **)(__ptr + 2) = pvVar9;
  __ptr_00 = (uint *)malloc(0x10);
  __ptr_00[1] = 0;
  *__ptr_00 = uVar16;
  if (uVar16 == 0) {
    pvVar9 = (void *)0x0;
  }
  else {
    pvVar9 = malloc((long)(int)uVar16 << 3);
  }
  *(void **)(__ptr_00 + 2) = pvVar9;
  if (0 < p->nStartCols) {
    lVar21 = 0;
    do {
      if (p->vObj2Lit->nSize <= lVar21) goto LAB_002c4abd;
      uVar7 = p->vObj2Lit->pArray[lVar21];
      if (fAnd != 0) {
        if ((int)uVar7 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x130,"int Abc_LitIsCompl(int)");
        }
        if ((uVar7 & 1) != 0) {
          __assert_fail("!fAnd || !Abc_LitIsCompl(iLit)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExtract.c"
                        ,0x263,"Abc_Ntk_t *Abc_NtkUpdateNetwork(Abc_ShaMan_t *, int)");
        }
      }
      if ((int)uVar7 < 0) {
LAB_002c4adc:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      pVVar12 = p->pNtk->vObjs;
      if (pVVar12->nSize <= (int)(uVar7 >> 1)) goto LAB_002c4a7f;
      pvVar9 = pVVar12->pArray[uVar7 >> 1];
      pAVar10 = Abc_AigConst1(p->pNtk);
      pAVar13 = (Abc_Obj_t *)((ulong)(~uVar7 & 1) ^ (ulong)pAVar10);
      if (fAnd != 0) {
        pAVar13 = pAVar10;
      }
      uVar7 = __ptr[1];
      uVar16 = *__ptr;
      if (uVar7 == uVar16) {
        if ((int)uVar16 < 0x10) {
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar11 = malloc(0x80);
          }
          else {
            pvVar11 = realloc(*(void **)(__ptr + 2),0x80);
          }
          uVar19 = 0x10;
        }
        else {
          uVar19 = uVar16 * 2;
          if ((int)uVar19 <= (int)uVar16) goto LAB_002c45b9;
          if (*(void **)(__ptr + 2) == (void *)0x0) {
            pvVar11 = malloc((ulong)uVar16 << 4);
          }
          else {
            pvVar11 = realloc(*(void **)(__ptr + 2),(ulong)uVar16 << 4);
          }
        }
        *(void **)(__ptr + 2) = pvVar11;
        *__ptr = uVar19;
      }
LAB_002c45b9:
      __ptr[1] = uVar7 + 1;
      *(void **)(*(long *)(__ptr + 2) + (long)(int)uVar7 * 8) = pvVar9;
      uVar7 = __ptr_00[1];
      uVar16 = *__ptr_00;
      if (uVar7 == uVar16) {
        if ((int)uVar16 < 0x10) {
          if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
            pvVar9 = malloc(0x80);
          }
          else {
            pvVar9 = realloc(*(void **)(__ptr_00 + 2),0x80);
          }
          uVar19 = 0x10;
        }
        else {
          uVar19 = uVar16 * 2;
          if ((int)uVar19 <= (int)uVar16) goto LAB_002c4630;
          if (*(void **)(__ptr_00 + 2) == (void *)0x0) {
            pvVar9 = malloc((ulong)uVar16 << 4);
          }
          else {
            pvVar9 = realloc(*(void **)(__ptr_00 + 2),(ulong)uVar16 << 4);
          }
        }
        *(void **)(__ptr_00 + 2) = pvVar9;
        *__ptr_00 = uVar19;
      }
LAB_002c4630:
      __ptr_00[1] = uVar7 + 1;
      *(Abc_Obj_t **)(*(long *)(__ptr_00 + 2) + (long)(int)uVar7 * 8) = pAVar13;
      p->nCountGates = p->nCountGates + -1;
      lVar21 = lVar21 + 1;
    } while (lVar21 < p->nStartCols);
  }
  pVVar12 = p->vBuckets;
  if (0 < pVVar12->nSize) {
    lVar21 = 0;
    do {
      pvVar9 = pVVar12->pArray[lVar21];
      if (0 < *(int *)((long)pvVar9 + 4)) {
        lVar20 = 0;
        do {
          lVar3 = *(long *)(*(long *)((long)pvVar9 + 8) + lVar20 * 8);
          uVar14 = (ulong)*(uint *)(lVar3 + 4);
          if (2 < (int)*(uint *)(lVar3 + 4)) {
            lVar17 = 2;
            do {
              uVar7 = (*(uint **)(lVar3 + 8))[lVar17];
              if (p->vObj2Lit->nSize <= (int)uVar7) {
                __assert_fail("ObjId < Vec_IntSize(p->vObj2Lit)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcExtract.c"
                              ,0x278,"Abc_Ntk_t *Abc_NtkUpdateNetwork(Abc_ShaMan_t *, int)");
              }
              if (p->nStartCols <= (int)uVar7) break;
              if ((int)uVar14 < 1) goto LAB_002c4abd;
              if (((int)uVar7 < 0) || ((int)__ptr_00[1] <= (int)uVar7)) goto LAB_002c4a7f;
              uVar16 = **(uint **)(lVar3 + 8);
              lVar4 = *(long *)(__ptr_00 + 2);
              pAVar13 = *(Abc_Obj_t **)(lVar4 + (ulong)uVar7 * 8);
              pAVar15 = p->pNtk;
              if (fAnd == 0) {
                if ((int)uVar16 < 0) goto LAB_002c4adc;
                if (pAVar15->vObjs->nSize <= (int)(uVar16 >> 1)) goto LAB_002c4a7f;
                pAVar13 = Abc_AigXor((Abc_Aig_t *)pAVar15->pManFunc,pAVar13,
                                     (Abc_Obj_t *)
                                     ((ulong)(uVar16 & 1) ^
                                     (ulong)pAVar15->vObjs->pArray[uVar16 >> 1]));
              }
              else {
                if ((int)uVar16 < 0) goto LAB_002c4adc;
                if (pAVar15->vObjs->nSize <= (int)(uVar16 >> 1)) goto LAB_002c4a7f;
                pAVar13 = Abc_AigAnd((Abc_Aig_t *)pAVar15->pManFunc,pAVar13,
                                     (Abc_Obj_t *)
                                     ((ulong)(uVar16 & 1) ^
                                     (ulong)pAVar15->vObjs->pArray[uVar16 >> 1]));
              }
              *(Abc_Obj_t **)(lVar4 + (ulong)uVar7 * 8) = pAVar13;
              p->nCountGates = p->nCountGates + 1;
              lVar17 = lVar17 + 1;
              uVar14 = (ulong)*(int *)(lVar3 + 4);
            } while (lVar17 < (long)uVar14);
          }
          lVar20 = lVar20 + 1;
        } while (lVar20 < *(int *)((long)pvVar9 + 4));
      }
      lVar21 = lVar21 + 1;
      pVVar12 = p->vBuckets;
    } while (lVar21 < pVVar12->nSize);
  }
  if (p->fVerbose != 0) {
    printf("Total gates collected = %d.  Total gates constructed = %d.\n",
           (ulong)(uint)p->nFoundGates,(ulong)(uint)p->nCountGates);
  }
  iVar2 = p->pNtk->vObjs->nSize;
  iVar6 = 0x10;
  if (0xe < iVar2 - 1U) {
    iVar6 = iVar2;
  }
  if (iVar6 == 0) {
    pvVar9 = (void *)0x0;
  }
  else {
    pvVar9 = malloc((long)iVar6 << 2);
  }
  if (pvVar9 != (void *)0x0) {
    memset(pvVar9,0xff,(long)iVar2 * 4);
  }
  uVar7 = __ptr[1];
  if (0 < (long)(int)uVar7) {
    lVar21 = *(long *)(__ptr + 2);
    uVar18 = 0;
    uVar14 = (ulong)__ptr_00[1];
    if ((int)__ptr_00[1] < 1) {
      uVar14 = uVar18;
    }
    do {
      if (uVar14 == uVar18) {
LAB_002c4a7f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      uVar5 = *(ulong *)(*(long *)(__ptr_00 + 2) + uVar18 * 8);
      iVar6 = *(int *)((uVar5 & 0xfffffffffffffffe) + 0x10);
      if (iVar6 < 0) goto LAB_002c4b1a;
      uVar16 = *(uint *)(*(long *)(lVar21 + uVar18 * 8) + 0x10);
      if (((int)uVar16 < 0) || (iVar2 <= (int)uVar16)) goto LAB_002c4afb;
      *(uint *)((long)pvVar9 + (ulong)uVar16 * 4) = ((uint)uVar5 & 1) + iVar6 * 2;
      uVar18 = uVar18 + 1;
    } while ((long)(int)uVar7 != uVar18);
  }
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  if (*(void **)(__ptr_00 + 2) != (void *)0x0) {
    free(*(void **)(__ptr_00 + 2));
    __ptr_00[2] = 0;
    __ptr_00[3] = 0;
  }
  free(__ptr_00);
  pAVar15 = p->pNtk;
  pVVar12 = pAVar15->vObjs;
  if (0 < pVVar12->nSize) {
    uVar7 = ((uint)pAVar8 & 1) + uVar1 * 2;
    lVar21 = 0;
    do {
      pvVar11 = pVVar12->pArray[lVar21];
      if (pvVar11 != (void *)0x0) {
        uVar16 = *(uint *)((long)pvVar11 + 0x14);
        if (((uVar16 & 0xf) < 8) && ((0x98U >> (uVar16 & 0xf) & 1) != 0)) {
          iVar6 = **(int **)((long)pvVar11 + 0x20);
          if (((long)iVar6 < 0) || (iVar2 <= iVar6)) {
LAB_002c4abd:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          uVar19 = *(uint *)((long)pvVar9 + (long)iVar6 * 4);
          if (-1 < (int)uVar19) {
            if ((fAnd == 0) || (uVar19 != uVar7)) {
              *(uint *)((long)pvVar11 + 0x14) = (uVar19 & 1) << 10 ^ uVar16;
              if (*(int *)((long)pvVar11 + 0x1c) < 1) {
LAB_002c4afb:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
              }
              uVar19 = uVar19 >> 1;
            }
            else {
              *(uint *)((long)pvVar11 + 0x14) = uVar16 ^ 0x400;
              uVar19 = uVar1;
              if (*(int *)((long)pvVar11 + 0x1c) < 1) goto LAB_002c4afb;
            }
            **(uint **)((long)pvVar11 + 0x20) = uVar19;
          }
        }
        uVar16 = *(uint *)((long)pvVar11 + 0x14);
        if ((uVar16 & 0xf) == 7) {
          iVar6 = *(int *)(*(long *)((long)pvVar11 + 0x20) + 4);
          if (((long)iVar6 < 0) || (iVar2 <= iVar6)) goto LAB_002c4abd;
          uVar19 = *(uint *)((long)pvVar9 + (long)iVar6 * 4);
          if (-1 < (int)uVar19) {
            if ((fAnd == 0) || (uVar19 != uVar7)) {
              *(uint *)((long)pvVar11 + 0x14) =
                   uVar16 & 0xfffff7f7 | (uVar19 << 0xb ^ uVar16) & 0x800;
              if (*(int *)((long)pvVar11 + 0x1c) < 2) goto LAB_002c4afb;
              uVar19 = uVar19 >> 1;
            }
            else {
              *(uint *)((long)pvVar11 + 0x14) = uVar16 ^ 0x800;
              uVar19 = uVar1;
              if (*(int *)((long)pvVar11 + 0x1c) < 2) goto LAB_002c4afb;
            }
            *(uint *)(*(long *)((long)pvVar11 + 0x20) + 4) = uVar19;
          }
        }
      }
      lVar21 = lVar21 + 1;
      pAVar15 = p->pNtk;
      pVVar12 = pAVar15->vObjs;
    } while (lVar21 < pVVar12->nSize);
  }
  if (pvVar9 != (void *)0x0) {
    free(pvVar9);
  }
  if (fAnd == 0) {
    pAVar15 = Abc_NtkBalanceExor(pAVar15,1,0);
    return pAVar15;
  }
  pAVar15 = Abc_NtkBalance(pAVar15,0,0,1);
  return pAVar15;
}

Assistant:

Abc_Ntk_t * Abc_NtkUpdateNetwork( Abc_ShaMan_t * p, int fAnd )
{
    Abc_Ntk_t * pNtk;
    Vec_Int_t * vInput, * vMap2Repl;
    Vec_Ptr_t * vOrig, * vRepl, * vBucket;
    Abc_Obj_t * pObj, * pNew;
    int i, j, k, ObjId, iLit;
    int iLitConst1 = Abc_ObjToLit( Abc_AigConst1(p->pNtk) );

    vOrig = Vec_PtrAlloc( p->nStartCols );
    vRepl = Vec_PtrAlloc( p->nStartCols );
    for ( i = 0; i < p->nStartCols; i++ )
    {
        iLit = Vec_IntEntry( p->vObj2Lit, i );
        assert( !fAnd || !Abc_LitIsCompl(iLit) );

        pObj = Abc_NtkObj( p->pNtk, Abc_Lit2Var(iLit) );

        if ( fAnd )
            pNew = Abc_AigConst1(p->pNtk);
        else
            pNew = Abc_ObjNotCond( Abc_AigConst1(p->pNtk), !Abc_LitIsCompl(iLit) );

        Vec_PtrPush( vOrig, pObj );
        Vec_PtrPush( vRepl, pNew );

        p->nCountGates--;
    }

    // go through the columns
    Vec_PtrForEachEntry( Vec_Ptr_t *, p->vBuckets, vBucket, i )
    Vec_PtrForEachEntry( Vec_Int_t *, vBucket, vInput, j )
    {
        Vec_IntForEachEntryStart( vInput, ObjId, k, SHARE_NUM )
        {
            assert( ObjId < Vec_IntSize(p->vObj2Lit) );
            if ( ObjId >= p->nStartCols )
                break;
            assert( ObjId < p->nStartCols );
            iLit = Vec_IntEntry( vInput, 0 );

            pNew = (Abc_Obj_t *)Vec_PtrEntry( vRepl, ObjId );
            if ( fAnd )
                pNew = Abc_AigAnd( (Abc_Aig_t *)p->pNtk->pManFunc, pNew, Abc_ObjFromLit(p->pNtk, iLit) );
            else
                pNew = Abc_AigXor( (Abc_Aig_t *)p->pNtk->pManFunc, pNew, Abc_ObjFromLit(p->pNtk, iLit) );
            Vec_PtrWriteEntry( vRepl, ObjId, pNew );
            p->nCountGates++;
        }
    }

    if ( p->fVerbose )
        printf( "Total gates collected = %d.  Total gates constructed = %d.\n", p->nFoundGates, p->nCountGates );

    // create map of originals
    vMap2Repl = Vec_IntStartFull( Abc_NtkObjNumMax(p->pNtk) );
    Vec_PtrForEachEntry( Abc_Obj_t *, vOrig, pObj, i )
    {
//        printf( "Replacing %d by %d.\n", Abc_ObjId(pObj), Abc_ObjToLit((Abc_Obj_t *)Vec_PtrEntry(vRepl, i)) );
        Vec_IntWriteEntry( vMap2Repl, Abc_ObjId(pObj), Abc_ObjToLit((Abc_Obj_t *)Vec_PtrEntry(vRepl, i)) );
    }
    Vec_PtrFree( vOrig );
    Vec_PtrFree( vRepl );

    // update fanin pointers
    Abc_NtkForEachObj( p->pNtk, pObj, i )
    {
        if ( Abc_ObjIsCo(pObj) || Abc_ObjIsNode(pObj) )
        {
            iLit = Vec_IntEntry( vMap2Repl, Abc_ObjFaninId0(pObj) );
            if ( iLit >= 0 )
            {
                if ( iLit == iLitConst1 && fAnd )
                {
                    pObj->fCompl0 ^= 1;
                    Vec_IntWriteEntry( &pObj->vFanins, 0, Abc_Lit2Var(iLitConst1) );
                }
                else
                {
                    pObj->fCompl0 ^= Abc_LitIsCompl(iLit);
                    Vec_IntWriteEntry( &pObj->vFanins, 0, Abc_Lit2Var(iLit) );
                }
            }
        }
        if ( Abc_ObjIsNode(pObj) )
        {
            iLit = Vec_IntEntry( vMap2Repl, Abc_ObjFaninId1(pObj) );
            if ( iLit >= 0 )
            {
                if ( iLit == iLitConst1 && fAnd )
                {
                    pObj->fCompl1 ^= 1;
                    Vec_IntWriteEntry( &pObj->vFanins, 1, Abc_Lit2Var(iLitConst1) );
                }
                else
                {
                    pObj->fCompl1 ^= Abc_LitIsCompl(iLit);
                    Vec_IntWriteEntry( &pObj->vFanins, 1, Abc_Lit2Var(iLit) );
                }
            }
        }
    }
    Vec_IntFree( vMap2Repl );

//    pNtk = Abc_NtkRestrash( p->pNtk, 1 );
    if ( fAnd )
        pNtk = Abc_NtkBalance( p->pNtk, 0, 0, 1 );
    else
        pNtk = Abc_NtkBalanceExor( p->pNtk, 1, 0 );
    return pNtk;
}